

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner-unix.c
# Opt level: O2

int process_wait(process_info_t *vec,int n,int timeout)

{
  uint __i;
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  int *piVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  dowait_args args;
  timeval tv;
  timeval timebase;
  pthread_t tid;
  pthread_attr_t attr;
  fd_set fds;
  
  args.pipe[0] = -1;
  args.pipe[1] = -1;
  args.vec = vec;
  args.n = n;
  if (timeout == -1) {
    dowait(&args);
    iVar1 = 0;
  }
  else {
    iVar1 = pipe(args.pipe);
    if (iVar1 == 0) {
      iVar1 = pthread_attr_init((pthread_attr_t *)&attr);
      if ((iVar1 == 0) &&
         (iVar1 = pthread_attr_setstacksize((pthread_attr_t *)&attr,0x40000), iVar1 == 0)) {
        iVar1 = pthread_create(&tid,(pthread_attr_t *)&attr,dowait,&args);
        iVar2 = pthread_attr_destroy((pthread_attr_t *)&attr);
        if (iVar2 == 0) {
          if (iVar1 != 0) {
            perror("pthread_create()");
            iVar1 = -1;
LAB_00107501:
            closefd(args.pipe[0]);
            closefd(args.pipe[1]);
            return iVar1;
          }
          iVar1 = gettimeofday((timeval *)&timebase,(__timezone_ptr_t)0x0);
          if (iVar1 == 0) {
            tv.tv_sec = timebase.tv_sec;
            tv.tv_usec = timebase.tv_usec;
            do {
              if ((tv.tv_sec <= timebase.tv_sec) &&
                 ((tv.tv_sec != timebase.tv_sec || (tv.tv_usec < timebase.tv_usec)))) {
                __assert_fail("tv.tv_sec > timebase.tv_sec || (tv.tv_sec == timebase.tv_sec && tv.tv_usec >= timebase.tv_usec)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/runner-unix.c"
                              ,300,"int process_wait(process_info_t *, int, int)");
              }
              uVar6 = ((int)tv.tv_sec - (int)timebase.tv_sec) * 1000 +
                      (int)(timebase.tv_usec / -1000) + (int)(tv.tv_usec / 1000);
              uVar3 = timeout - uVar6;
              if ((uint)timeout < uVar6 || uVar3 == 0) {
LAB_001074c3:
                uVar8 = 0;
                uVar7 = (ulong)(uint)n;
                if (n < 1) {
                  uVar7 = uVar8;
                }
                iVar1 = -2;
                for (; uVar7 * 0x20 != uVar8; uVar8 = uVar8 + 0x20) {
                  kill(*(__pid_t *)((long)&vec->pid + uVar8),0xf);
                }
LAB_001074f1:
                iVar2 = pthread_join(tid,(void **)0x0);
                if (iVar2 == 0) goto LAB_00107501;
                break;
              }
              tv.tv_sec = (ulong)uVar3 / 1000;
              tv.tv_usec = (__suseconds_t)((uVar3 % 1000) * 1000);
              for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
                fds.fds_bits[lVar4] = 0;
              }
              fds.fds_bits[args.pipe[0] / 0x40] =
                   fds.fds_bits[args.pipe[0] / 0x40] | 1L << ((byte)args.pipe[0] & 0x3f);
              iVar1 = select(args.pipe[0] + 1,(fd_set *)&fds,(fd_set *)0x0,(fd_set *)0x0,
                             (timeval *)&tv);
              if (iVar1 != -1) {
                if (iVar1 == 0) goto LAB_001074c3;
                iVar1 = 0;
                goto LAB_001074f1;
              }
              piVar5 = __errno_location();
              if (*piVar5 != 4) {
                perror("select()");
                iVar1 = -1;
                goto LAB_001074f1;
              }
              iVar1 = gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
            } while (iVar1 == 0);
          }
        }
      }
      abort();
    }
    perror("pipe()");
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int process_wait(process_info_t* vec, int n, int timeout) {
  int i;
  int r;
  int retval;
  process_info_t* p;
  dowait_args args;
  pthread_t tid;
  pthread_attr_t attr;
  unsigned int elapsed_ms;
  struct timeval timebase;
  struct timeval tv;
  fd_set fds;

  args.vec = vec;
  args.n = n;
  args.pipe[0] = -1;
  args.pipe[1] = -1;

  /* The simple case is where there is no timeout */
  if (timeout == -1) {
    dowait(&args);
    return 0;
  }

  /* Hard case. Do the wait with a timeout.
   *
   * Assumption: we are the only ones making this call right now. Otherwise
   * we'd need to lock vec.
   */

  r = pipe((int*)&(args.pipe));
  if (r) {
    perror("pipe()");
    return -1;
  }

  if (pthread_attr_init(&attr))
    abort();

#if defined(__MVS__)
  if (pthread_attr_setstacksize(&attr, 1024 * 1024))
#else
  if (pthread_attr_setstacksize(&attr, 256 * 1024))
#endif
    abort();

  r = pthread_create(&tid, &attr, dowait, &args);

  if (pthread_attr_destroy(&attr))
    abort();

  if (r) {
    perror("pthread_create()");
    retval = -1;
    goto terminate;
  }

  if (gettimeofday(&timebase, NULL))
    abort();

  tv = timebase;
  for (;;) {
    /* Check that gettimeofday() doesn't jump back in time. */
    assert(tv.tv_sec > timebase.tv_sec ||
           (tv.tv_sec == timebase.tv_sec && tv.tv_usec >= timebase.tv_usec));

    elapsed_ms =
        (tv.tv_sec - timebase.tv_sec) * 1000 +
        (tv.tv_usec / 1000) -
        (timebase.tv_usec / 1000);

    r = 0;  /* Timeout. */
    if (elapsed_ms >= (unsigned) timeout)
      break;

    tv.tv_sec = (timeout - elapsed_ms) / 1000;
    tv.tv_usec = (timeout - elapsed_ms) % 1000 * 1000;

    FD_ZERO(&fds);
    FD_SET(args.pipe[0], &fds);

    r = select(args.pipe[0] + 1, &fds, NULL, NULL, &tv);
    if (!(r == -1 && errno == EINTR))
      break;

    if (gettimeofday(&tv, NULL))
      abort();
  }

  if (r == -1) {
    perror("select()");
    retval = -1;

  } else if (r) {
    /* The thread completed successfully. */
    retval = 0;

  } else {
    /* Timeout. Kill all the children. */
    for (i = 0; i < n; i++) {
      p = &vec[i];
      kill(p->pid, SIGTERM);
    }
    retval = -2;
  }

  if (pthread_join(tid, NULL))
    abort();

terminate:
  closefd(args.pipe[0]);
  closefd(args.pipe[1]);
  return retval;
}